

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

bool __thiscall Analyser::isConstant(Analyser *this,string *var)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Optional_payload_base<int> local_28;
  optional<int> index;
  string *var_local;
  Analyser *this_local;
  
  index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)var;
  local_28 = (_Optional_payload_base<int>)getIndexInLocal(this,var);
  bVar1 = std::optional<int>::has_value((optional<int> *)&local_28);
  if (bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
             ::operator[](&this->_localVars,
                          (key_type *)
                          index.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>);
    if ((pmVar2->first & 1U) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    local_28 = (_Optional_payload_base<int>)
               getIndexInGlobal(this,(string *)
                                     index.super__Optional_base<int,_true,_true>._M_payload.
                                     super__Optional_payload_base<int>);
    bVar1 = std::optional<int>::has_value((optional<int> *)&local_28);
    if (bVar1) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
               ::operator[](&this->_globalVars,
                            (key_type *)
                            index.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>);
      if ((pmVar2->first & 1U) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Analyser::isConstant(const std::string& var)
{
	std::optional<std::int32_t> index = getIndexInLocal(var);
	if (index.has_value()) {
		if (_localVars[var].first) {
			return true;
		}
		return false;
	}
	index = getIndexInGlobal(var);
	if (index.has_value()) {
		if (_globalVars[var].first) {
			return true;
		}
		return false;
	}
	return false;
}